

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

cmpResult __thiscall llvm::detail::IEEEFloat::compare(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  cmpResult cVar4;
  uint uVar5;
  
  if (this->semantics == rhs->semantics) {
    bVar1 = this->field_0x12;
    bVar2 = rhs->field_0x12;
    cVar4 = cmpUnordered;
    switch((bVar2 & 7) + (bVar1 & 7) * '\x04') {
    case 0:
      uVar5 = bVar1 >> 3 & 1;
      cVar4 = cmpEqual;
      if (SUB41(uVar5,0) != ((bVar2 >> 3 & 1) != 0)) {
        cVar4 = uVar5 * 2 ^ cmpGreaterThan;
      }
      break;
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 9:
    case 0xd:
      break;
    case 2:
    case 3:
    case 0xb:
      cVar4 = ~(uint)bVar1 >> 2 & cmpGreaterThan;
      break;
    case 8:
    case 0xc:
    case 0xe:
      cVar4 = bVar2 >> 2 & cmpGreaterThan;
      break;
    case 10:
      bVar3 = (bool)(bVar1 >> 3 & 1);
      if (bVar3 == ((bVar2 >> 3 & 1) != 0)) {
        cVar4 = compareAbsoluteValue(this,rhs);
        if ((this->field_0x12 & 8) != 0) {
          if (cVar4 == cmpLessThan) {
            cVar4 = cmpGreaterThan;
          }
          else if (cVar4 == cmpGreaterThan) {
            cVar4 = cmpLessThan;
          }
        }
      }
      else {
        cVar4 = (uint)(byte)(bVar3 * '\x02' ^ 2);
      }
      break;
    case 0xf:
      cVar4 = cmpEqual;
      break;
    default:
      llvm_unreachable_internal
                ((char *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                 ,0x744);
    }
    return cVar4;
  }
  __assert_fail("semantics == rhs.semantics",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x740,
                "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compare(const IEEEFloat &) const");
}

Assistant:

IEEEFloat::cmpResult IEEEFloat::compare(const IEEEFloat &rhs) const {
  cmpResult result;

  assert(semantics == rhs.semantics);

  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    return cmpUnordered;

  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcInfinity, fcZero):
  case PackCategoriesIntoKey(fcNormal, fcZero):
    if (sign)
      return cmpLessThan;
    else
      return cmpGreaterThan;

  case PackCategoriesIntoKey(fcNormal, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcNormal):
    if (rhs.sign)
      return cmpGreaterThan;
    else
      return cmpLessThan;

  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
    if (sign == rhs.sign)
      return cmpEqual;
    else if (sign)
      return cmpLessThan;
    else
      return cmpGreaterThan;

  case PackCategoriesIntoKey(fcZero, fcZero):
    return cmpEqual;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    break;
  }

  /* Two normal numbers.  Do they have the same sign?  */
  if (sign != rhs.sign) {
    if (sign)
      result = cmpLessThan;
    else
      result = cmpGreaterThan;
  } else {
    /* Compare absolute values; invert result if negative.  */
    result = compareAbsoluteValue(rhs);

    if (sign) {
      if (result == cmpLessThan)
        result = cmpGreaterThan;
      else if (result == cmpGreaterThan)
        result = cmpLessThan;
    }
  }

  return result;
}